

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O0

void __thiscall ElfSegment::writeData(ElfSegment *this,ByteArray *output)

{
  Elf32_Off EVar1;
  size_type sVar2;
  size_t sVar3;
  reference ppEVar4;
  int *piVar5;
  int local_28;
  int local_24;
  int i;
  int local_1c;
  ByteArray *pBStack_18;
  int align;
  ByteArray *output_local;
  ElfSegment *this_local;
  
  pBStack_18 = output;
  output_local = (ByteArray *)this;
  sVar2 = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::size(&this->sections);
  if (sVar2 == 0) {
    ByteArray::alignSize(pBStack_18,(ulong)(this->header).p_align);
    if ((this->header).p_offset == (this->header).p_paddr) {
      sVar3 = ByteArray::size(pBStack_18);
      (this->header).p_paddr = (Elf32_Addr)sVar3;
    }
    sVar3 = ByteArray::size(pBStack_18);
    (this->header).p_offset = (Elf32_Off)sVar3;
  }
  else {
    ppEVar4 = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::operator[]
                        (&this->sections,0);
    i = ElfSection::getAlignment(*ppEVar4);
    local_24 = 0x10;
    piVar5 = std::max<int>(&i,&local_24);
    local_1c = *piVar5;
    ByteArray::alignSize(pBStack_18,(long)local_1c);
    sVar3 = ByteArray::size(pBStack_18);
    (this->header).p_offset = (Elf32_Off)sVar3;
    local_28 = 0;
    while( true ) {
      sVar2 = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::size(&this->sections);
      if ((int)sVar2 <= local_28) break;
      ppEVar4 = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::operator[]
                          (&this->sections,(long)local_28);
      ElfSection::setOffsetBase(*ppEVar4,(this->header).p_offset);
      local_28 = local_28 + 1;
    }
    if (this->paddrSection != (ElfSection *)0x0) {
      EVar1 = ElfSection::getOffset(this->paddrSection);
      (this->header).p_paddr = EVar1;
    }
    ByteArray::append(pBStack_18,&this->data);
  }
  return;
}

Assistant:

void ElfSegment::writeData(ByteArray& output)
{
	if (sections.size() == 0)
	{
		output.alignSize(header.p_align);
		if (header.p_offset == header.p_paddr)
			header.p_paddr = (Elf32_Addr) output.size();

		header.p_offset = (Elf32_Off) output.size();
		return;
	}

	// align segment to alignment of first section
	int align = std::max<int>(sections[0]->getAlignment(),16);
	output.alignSize(align);

	header.p_offset = (Elf32_Off) output.size();
	for (int i = 0; i < (int)sections.size(); i++)
	{
		sections[i]->setOffsetBase(header.p_offset);
	}

	if (paddrSection)
	{
		header.p_paddr = paddrSection->getOffset();
	}

	output.append(data);
}